

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTest.cpp
# Opt level: O2

bool __thiscall CaptureCborTest::DoTest(CaptureCborTest *this)

{
  bool bVar1;
  bool bVar2;
  CaptureSummary cs;
  CaptureSummary tcs;
  char *list [1];
  DnsStats capture;
  
  DnsStats::DnsStats(&capture);
  CaptureSummary::CaptureSummary(&cs);
  list[0] = "cdns/test/data/gold.cbor";
  bVar1 = DnsStats::LoadCborFiles(&capture,1,list);
  if (bVar1) {
    bVar1 = DnsStats::ExportToCaptureSummary(&capture,&cs);
    if (bVar1) {
      CaptureSummary::CaptureSummary(&tcs);
      bVar1 = CaptureSummary::Load(&tcs,"data/capture_gold.csv");
      if (bVar1) {
        CaptureSummary::Sort(&cs);
        CaptureSummary::Sort(&tcs);
        bVar2 = ithi_test_class::CompareCS(&cs,&tcs);
        bVar1 = true;
        if (!bVar2) {
          CaptureSummary::Save(&cs,"gold-cbor-out.csv");
          goto LAB_0018348c;
        }
      }
      else {
LAB_0018348c:
        bVar1 = false;
      }
      CaptureSummary::~CaptureSummary(&tcs);
      goto LAB_0018349c;
    }
  }
  bVar1 = false;
LAB_0018349c:
  CaptureSummary::~CaptureSummary(&cs);
  DnsStats::~DnsStats(&capture);
  return bVar1;
}

Assistant:

bool CaptureCborTest::DoTest()
{
    DnsStats capture;
    CaptureSummary cs;
    char const* list[1] = { cbor_input_test };
    bool ret = capture.LoadCborFiles(1, list);

    if (ret)
    {
        ret = capture.ExportToCaptureSummary(&cs);

        if (ret)
        {
            CaptureSummary tcs;

            ret = tcs.Load(cbor_test_output);

            if (ret)
            {
                cs.Sort();
                tcs.Sort();

                ret = ithi_test_class::CompareCS(&cs, &tcs);

                if (!ret)
                {
                    cs.Save(cbor_test_debug);
                }
            }
        }
    }

    return ret;
}